

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O2

void __thiscall Refal2::CQualifierBuilder::AddChar(CQualifierBuilder *this,TChar c)

{
  bool bVar1;
  undefined7 in_register_00000031;
  size_t __position;
  TChar c_local;
  
  c_local = c;
  if (c < '\0') {
    if (this->negative == true) {
      CSetBuilder<char>::Exclude(&this->charsBuilder,&c_local);
    }
    else {
      CSetBuilder<char>::Include(&this->charsBuilder,&c_local);
    }
  }
  else {
    __position = (size_t)(int)CONCAT71(in_register_00000031,c);
    bVar1 = std::bitset<128UL>::test(&this->ansicharsFixed,__position);
    if (!bVar1) {
      std::bitset<128UL>::set(&this->ansichars,__position,(bool)(this->negative ^ 1));
      std::bitset<128UL>::set(&this->ansicharsFixed,__position,true);
      return;
    }
  }
  return;
}

Assistant:

void CQualifierBuilder::AddChar( const TChar c )
{
	std::size_t tmpc = static_cast<std::size_t>( c );
	if( tmpc < AnsiSetSize ) {
		if( !ansicharsFixed.test( tmpc ) ) {
			ansichars.set( tmpc, !negative );
			ansicharsFixed.set( tmpc );
		}
	} else {
		if( negative ) {
			charsBuilder.Exclude( c );
		} else {
			charsBuilder.Include( c );
		}
	}
}